

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int vrna_E_ext_loop_3(vrna_fold_compound_t *fc,int i)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  vrna_hc_t *pvVar4;
  vrna_sc_t *pvVar5;
  vrna_sc_t **ppvVar6;
  vrna_ud_t *pvVar7;
  vrna_param_t *pvVar8;
  short *psVar9;
  char **ppcVar10;
  uint *puVar11;
  char *pcVar12;
  short **ppsVar13;
  uint **ppuVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  uchar uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint type;
  int iVar27;
  int iVar28;
  code *evaluate;
  code *pcVar29;
  int *piVar30;
  int *stems;
  long lVar31;
  void *pvVar32;
  void *pvVar33;
  void *pvVar34;
  undefined2 uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  code *pcVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  code *pcVar43;
  ulong uVar44;
  code *pcVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  code *pcVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  bool bVar57;
  int local_180;
  int local_124;
  sc_wrapper_f3 sc_wrapper;
  default_data hc_dat_local;
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    return 10000000;
  }
  uVar15 = (ulong)(uint)i;
  pvVar4 = fc->hc;
  iVar22 = (fc->params->model_details).dangles;
  iVar38 = (fc->params->model_details).gquad;
  hc_dat_local.mx_window = (uchar **)(pvVar4->field_3).field_0.matrix;
  hc_dat_local.hc_up = pvVar4->up_ext;
  hc_dat_local.sn = fc->strand_number;
  if (pvVar4->f == (vrna_callback_hc_evaluate *)0x0) {
    evaluate = hc_default_window;
  }
  else {
    hc_dat_local.hc_dat = pvVar4->data;
    evaluate = hc_default_user_window;
    hc_dat_local.hc_f = pvVar4->f;
  }
  sc_wrapper.n = fc->length;
  sc_wrapper.n_seq = 1;
  sc_wrapper.up = (int **)0x0;
  sc_wrapper.red_ext = (undefined1 *)0x0;
  sc_wrapper.red_stem = (undefined1 *)0x0;
  sc_wrapper.decomp_stem = (undefined1 *)0x0;
  sc_wrapper.user_data = (void *)0x0;
  sc_wrapper.decomp_stem1 = (undefined1 *)0x0;
  sc_wrapper.user_cb = (vrna_callback_sc_energy *)0x0;
  sc_wrapper.user_data_comparative = (void **)0x0;
  sc_wrapper.up_comparative = (int ***)0x0;
  sc_wrapper.user_cb_comparative = (vrna_callback_sc_energy **)0x0;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    ppvVar6 = (fc->field_23).field_1.scs;
    sc_wrapper.n_seq = (fc->field_23).field_1.n_seq;
    sc_wrapper.a2s = (fc->field_23).field_1.a2s;
    bVar16 = false;
    if (ppvVar6 != (vrna_sc_t **)0x0) {
      sc_wrapper.up_comparative = (int ***)vrna_alloc(sc_wrapper.n_seq << 3);
      sc_wrapper.user_cb_comparative =
           (vrna_callback_sc_energy **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
      sc_wrapper.user_data_comparative = (void **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
      bVar57 = false;
      for (uVar49 = 0; uVar49 < (fc->field_23).field_1.n_seq; uVar49 = uVar49 + 1) {
        if (ppvVar6[uVar49] != (vrna_sc_t *)0x0) {
          sc_wrapper.up_comparative[uVar49] = ppvVar6[uVar49]->energy_up;
          sc_wrapper.user_cb_comparative[uVar49] = ppvVar6[uVar49]->f;
          sc_wrapper.user_data_comparative[uVar49] = ppvVar6[uVar49]->data;
          if (ppvVar6[uVar49]->energy_up != (int **)0x0) {
            bVar16 = true;
          }
          if (ppvVar6[uVar49]->f != (vrna_callback_sc_energy *)0x0) {
            bVar57 = true;
          }
        }
      }
      if (bVar16) {
        bVar57 = !bVar57;
        pcVar52 = sc_user_def_f3_reduce_to_ext_comparative;
        if (bVar57) {
          pcVar52 = sc_default_f3_reduce_comparative;
        }
        pcVar29 = sc_user_def_f3_reduce_to_stem_comparative;
        if (bVar57) {
          pcVar29 = sc_default_f3_reduce_comparative;
        }
        pcVar39 = sc_user_def_f3_split_in_stem_ext_comparative;
        if (bVar57) {
          pcVar39 = sc_default_f3_split_in_stem_ext_comparative;
        }
        pcVar45 = sc_default_f3_split_in_stem_ext1_comparative;
        pcVar43 = sc_user_def_f3_split_in_stem_ext1_comparative;
        goto LAB_00117038;
      }
      if (bVar57) {
        sc_wrapper.red_ext = sc_user_f3_reduce_to_ext_comparative;
        sc_wrapper.red_stem = sc_user_f3_reduce_to_stem_comparative;
        sc_wrapper.decomp_stem = sc_user_f3_split_in_stem_ext_comparative;
        sc_wrapper.decomp_stem1 = sc_user_f3_split_in_stem_ext1_comparative;
      }
    }
  }
  else if ((fc->type == VRNA_FC_TYPE_SINGLE) &&
          (pvVar5 = (fc->field_23).field_0.sc, pvVar5 != (vrna_sc_t *)0x0)) {
    sc_wrapper.up = pvVar5->energy_up;
    sc_wrapper.user_cb = pvVar5->f;
    sc_wrapper.user_data = pvVar5->data;
    if (sc_wrapper.up == (int **)0x0) {
      if (sc_wrapper.user_cb != (vrna_callback_sc_energy *)0x0) {
        sc_wrapper.red_ext = sc_user_f3_reduce_to_ext;
        sc_wrapper.red_stem = sc_user_f3_reduce_to_stem;
        sc_wrapper.decomp_stem = sc_user_f3_split_in_stem_ext;
        sc_wrapper.decomp_stem1 = sc_user_f3_split_in_stem_ext1;
      }
    }
    else {
      bVar57 = sc_wrapper.user_cb == (vrna_callback_sc_energy *)0x0;
      pcVar52 = sc_user_def_f3_reduce_to_ext;
      if (bVar57) {
        pcVar52 = sc_default_f3_reduce;
      }
      pcVar29 = sc_user_def_f3_reduce_to_stem;
      if (bVar57) {
        pcVar29 = sc_default_f3_reduce;
      }
      pcVar39 = sc_user_def_f3_split_in_stem_ext;
      if (bVar57) {
        pcVar39 = sc_default_f3_split_in_stem_ext;
      }
      pcVar45 = sc_default_f3_split_in_stem_ext1;
      pcVar43 = sc_user_def_f3_split_in_stem_ext1;
LAB_00117038:
      sc_wrapper.red_ext = pcVar52;
      sc_wrapper.red_stem = pcVar29;
      sc_wrapper.decomp_stem = pcVar39;
      sc_wrapper.decomp_stem1 = pcVar43;
      if (bVar57) {
        sc_wrapper.decomp_stem1 = pcVar45;
      }
    }
  }
  puVar17 = sc_wrapper.red_ext;
  uVar3 = fc->length;
  piVar30 = (fc->matrices->field_2).field_0.f5;
  pvVar7 = fc->domains_up;
  lVar40 = (long)i;
  lVar50 = lVar40 + 1;
  local_124 = 10000000;
  local_180 = (int)lVar50;
  if (((piVar30[lVar40 + 1] != 10000000) &&
      (uVar19 = (*evaluate)(i,uVar3,local_180,uVar3,'\f',&hc_dat_local), uVar19 != '\0')) &&
     (local_124 = piVar30[lVar50], puVar17 != (undefined1 *)0x0)) {
    iVar20 = (*(code *)puVar17)(uVar15,lVar50,uVar3,&sc_wrapper);
    local_124 = local_124 + iVar20;
  }
  if ((pvVar7 != (vrna_ud_t *)0x0) && (pvVar7->energy_cb != (vrna_callback_ud_energy *)0x0)) {
    for (lVar53 = 0; lVar53 < pvVar7->uniq_motif_count; lVar53 = lVar53 + 1) {
      uVar49 = (int)pvVar7->uniq_motif_size[lVar53] + lVar40;
      iVar20 = (int)uVar49 + -1;
      if (((iVar20 <= (int)uVar3) && (piVar30[uVar49] != 10000000)) &&
         (uVar19 = (*evaluate)(i,uVar3,iVar20,uVar3,'\f',&hc_dat_local), uVar19 != '\0')) {
        iVar21 = piVar30[uVar49];
        iVar20 = (*pvVar7->energy_cb)(fc,i,iVar20,0x11,pvVar7->data);
        iVar20 = iVar20 + iVar21;
        if (puVar17 != (undefined1 *)0x0) {
          iVar21 = (*(code *)puVar17)(uVar15,uVar49 & 0xffffffff,uVar3,&sc_wrapper);
          iVar20 = iVar20 + iVar21;
        }
        if (iVar20 <= local_124) {
          local_124 = iVar20;
        }
      }
    }
  }
  uVar3 = fc->length;
  uVar49 = (ulong)uVar3;
  iVar20 = fc->window_size;
  lVar53 = (long)(int)uVar3;
  if (iVar22 == 2) {
    pvVar8 = fc->params;
    lVar50 = *(long *)((fc->matrices->field_2).field_0.c + lVar40 * 2);
    lVar47 = lVar50 + lVar40 * -4;
    iVar22 = (pvVar8->model_details).min_loop_size;
    piVar30 = (int *)vrna_alloc(iVar20 * 4 + 0x18);
    puVar18 = sc_wrapper.decomp_stem;
    puVar17 = sc_wrapper.red_stem;
    stems = piVar30 + -lVar40;
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      psVar9 = (fc->field_23).field_0.sequence_encoding;
      if (i < 2) {
        uVar26 = 0xffffffff;
      }
      else {
        uVar26 = (uint)psVar9[uVar15 - 1];
      }
      ppcVar10 = fc->ptype_local;
      uVar25 = iVar20 + i;
      uVar24 = uVar3 - 1;
      if ((int)uVar25 < (int)uVar3) {
        uVar24 = uVar25;
      }
      uVar44 = (ulong)(local_180 + iVar22);
      lVar50 = lVar50 + uVar44 * 4 + lVar40 * -4;
      for (lVar31 = 0; (long)(uVar44 + lVar31) <= (long)(int)uVar24; lVar31 = lVar31 + 1) {
        piVar30[(uVar44 + lVar31) - lVar40] = 10000000;
        if (*(int *)(lVar50 + lVar31 * 4) != 10000000) {
          iVar21 = iVar22 + i + (int)lVar31 + 1;
          uVar19 = (*evaluate)(i,uVar3,iVar21,iVar22 + i + 2 + (int)lVar31,'\x10',&hc_dat_local);
          if (uVar19 != '\0') {
            type = vrna_get_ptype_window(i,iVar21,ppcVar10);
            iVar21 = *(int *)(lVar50 + lVar31 * 4);
            iVar36 = vrna_E_ext_stem(type,uVar26,(int)psVar9[uVar44 + lVar31 + 1],pvVar8);
            piVar30[(uVar44 + lVar31) - lVar40] = iVar36 + iVar21;
          }
        }
      }
      if (puVar18 != (undefined1 *)0x0) {
        for (; (long)uVar44 <= (long)(int)uVar24; uVar44 = uVar44 + 1) {
          if (stems[uVar44] != 10000000) {
            iVar22 = (*(code *)puVar18)(uVar15,uVar44 & 0xffffffff,(int)uVar44 + 1,&sc_wrapper);
            stems[uVar44] = stems[uVar44] + iVar22;
          }
        }
      }
      if (((uVar3 <= uVar25) &&
          (stems[lVar53] = 10000000, *(int *)(lVar47 + lVar53 * 4) != 10000000)) &&
         (uVar19 = (*evaluate)(i,uVar3,i,uVar3,'\x0e',&hc_dat_local), uVar19 != '\0')) {
        uVar24 = vrna_get_ptype_window(i,uVar3,ppcVar10);
        if ((int)uVar26 < 0) {
          iVar22 = 0;
        }
        else {
          iVar22 = pvVar8->dangle5[uVar24][uVar26];
        }
        if (2 < uVar24) {
          iVar22 = iVar22 + pvVar8->TerminalAU;
        }
        stems[lVar53] = iVar22 + *(int *)(lVar47 + lVar53 * 4);
        if (puVar17 != (undefined1 *)0x0) {
          iVar22 = (*(code *)puVar17)(uVar15,uVar15,uVar49,&sc_wrapper);
          stems[lVar53] = stems[lVar53] + iVar22;
        }
      }
    }
    else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      uVar26 = (fc->field_23).field_1.n_seq;
      uVar54 = (ulong)uVar26;
      pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
      pvVar5 = (fc->field_23).field_0.sc;
      ppsVar13 = (fc->field_23).field_1.S3;
      ppuVar14 = (fc->field_23).field_1.a2s;
      uVar26 = uVar26 * 2;
      pvVar32 = vrna_alloc(uVar26);
      pvVar33 = vrna_alloc(uVar26);
      for (uVar44 = 0; uVar54 != uVar44; uVar44 = uVar44 + 1) {
        uVar35 = 0xffff;
        if (1 < ppuVar14[uVar44][lVar40]) {
          uVar35 = *(undefined2 *)(*(long *)(&pvVar5->type + uVar44 * 2) + lVar40 * 2);
        }
        *(undefined2 *)((long)pvVar32 + uVar44 * 2) = uVar35;
        *(undefined2 *)((long)pvVar33 + uVar44 * 2) =
             *(undefined2 *)(*(long *)(pcVar12 + uVar44 * 8) + lVar40 * 2);
      }
      uVar24 = iVar20 + i;
      uVar26 = uVar3 - 1;
      if ((int)uVar24 < (int)uVar3) {
        uVar26 = uVar24;
      }
      lVar31 = (long)(iVar22 + local_180);
      for (lVar50 = lVar31; lVar50 <= (int)uVar26; lVar50 = lVar50 + 1) {
        stems[lVar50] = 10000000;
        if ((*(int *)(lVar47 + lVar50 * 4) != 10000000) &&
           (uVar19 = (*evaluate)(i,uVar3,(int)lVar50,(int)lVar50 + 1,'\x10',&hc_dat_local),
           uVar19 != '\0')) {
          iVar22 = *(int *)(lVar47 + lVar50 * 4);
          for (uVar44 = 0; uVar54 != uVar44; uVar44 = uVar44 + 1) {
            uVar25 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar44 * 2),
                                       (int)*(short *)(*(long *)(pcVar12 + uVar44 * 8) + lVar50 * 2)
                                       ,&pvVar8->model_details);
            puVar11 = ppuVar14[uVar44];
            iVar21 = -1;
            if (puVar11[lVar50] < puVar11[uVar49]) {
              iVar21 = (int)ppsVar13[uVar44][lVar50];
            }
            iVar21 = vrna_E_ext_stem(uVar25,(int)*(short *)((long)pvVar32 + uVar44 * 2),iVar21,
                                     pvVar8);
            iVar22 = iVar22 + iVar21;
          }
          stems[lVar50] = iVar22;
        }
      }
      if (puVar18 != (undefined1 *)0x0) {
        for (; lVar31 <= (int)uVar26; lVar31 = lVar31 + 1) {
          if (stems[lVar31] != 10000000) {
            iVar22 = (*(code *)puVar18)(uVar15,lVar31,(int)lVar31 + 1,&sc_wrapper);
            stems[lVar31] = stems[lVar31] + iVar22;
          }
        }
      }
      if (((uVar3 <= uVar24) &&
          (stems[lVar53] = 10000000, *(int *)(lVar47 + lVar53 * 4) != 10000000)) &&
         (uVar19 = (*evaluate)(i,uVar3,i,uVar3,'\x0e',&hc_dat_local), uVar19 != '\0')) {
        iVar22 = *(int *)(lVar47 + lVar53 * 4);
        for (uVar44 = 0; uVar54 != uVar44; uVar44 = uVar44 + 1) {
          uVar26 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar44 * 2),
                                     (int)*(short *)(*(long *)(pcVar12 + uVar44 * 8) + lVar53 * 2),
                                     &pvVar8->model_details);
          lVar50 = (long)*(short *)((long)pvVar32 + uVar44 * 2);
          if (lVar50 < 0) {
            iVar21 = 0;
          }
          else {
            iVar21 = pvVar8->dangle5[uVar26][lVar50];
          }
          if (2 < uVar26) {
            iVar21 = iVar21 + pvVar8->TerminalAU;
          }
          iVar22 = iVar22 + iVar21;
        }
        if (puVar17 != (undefined1 *)0x0) {
          iVar21 = (*(code *)puVar17)(uVar15,uVar15,uVar49,&sc_wrapper);
          iVar22 = iVar22 + iVar21;
        }
        stems[lVar53] = iVar22;
      }
      free(pvVar32);
      free(pvVar33);
    }
    iVar20 = iVar20 + i;
    iVar22 = uVar3 - 1;
    if (iVar20 < (int)uVar3) {
      iVar22 = iVar20;
    }
    iVar22 = decompose_f3_ext_stem(fc,i,iVar22,stems);
    if (((int)uVar3 <= iVar20) && (stems[lVar53] <= iVar22)) {
      iVar22 = stems[lVar53];
    }
  }
  else {
    if (iVar22 != 0) {
      piVar30 = f3_get_stem_contributions_d0(fc,i,evaluate,&hc_dat_local,&sc_wrapper);
      iVar20 = iVar20 + i;
      iVar22 = uVar3 - 1;
      if (iVar20 < (int)uVar3) {
        iVar22 = iVar20;
      }
      iVar21 = decompose_f3_ext_stem(fc,i,iVar22,piVar30);
      if (((int)uVar3 <= iVar20) && (piVar30[lVar53] <= iVar21)) {
        iVar21 = piVar30[lVar53];
      }
      free(piVar30 + lVar40);
      uVar26 = fc->length;
      lVar47 = (long)(int)uVar26;
      iVar22 = fc->window_size;
      pvVar8 = fc->params;
      lVar31 = *(long *)((fc->matrices->field_2).field_0.c + lVar40 * 2) + lVar40 * -4;
      iVar36 = (pvVar8->model_details).min_loop_size;
      pvVar32 = vrna_alloc(iVar22 * 4 + 0x18);
      puVar18 = sc_wrapper.decomp_stem;
      puVar17 = sc_wrapper.red_stem;
      piVar30 = (int *)((long)pvVar32 + lVar40 * -4);
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar24 = (fc->field_23).field_1.n_seq;
        uVar44 = (ulong)uVar24;
        pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
        ppsVar13 = (fc->field_23).field_1.S3;
        ppuVar14 = (fc->field_23).field_1.a2s;
        pvVar33 = vrna_alloc(uVar24 * 2);
        for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
          *(undefined2 *)((long)pvVar33 + uVar49 * 2) =
               *(undefined2 *)(*(long *)(pcVar12 + uVar49 * 8) + lVar40 * 2);
        }
        iVar23 = iVar22 + i + 1;
        iVar46 = uVar26 - 1;
        if ((int)uVar26 <= iVar23) {
          iVar23 = iVar46;
        }
        uVar54 = (ulong)(iVar36 + local_180);
        uVar49 = uVar54;
        while (uVar55 = uVar49, (long)uVar55 <= (long)iVar23) {
          piVar30[uVar55] = 10000000;
          if (*(int *)(lVar31 + -4 + uVar55 * 4) == 10000000) {
            uVar49 = uVar55 + 1;
          }
          else {
            uVar49 = uVar55 + 1;
            uVar19 = (*evaluate)(i,uVar26,(int)uVar55 + -1,(int)uVar49,'\x10',&hc_dat_local);
            if (uVar19 != '\0') {
              iVar36 = *(int *)(lVar31 + -4 + uVar55 * 4);
              for (uVar51 = 0; uVar44 != uVar51; uVar51 = uVar51 + 1) {
                uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar51 * 2),
                                           (int)*(short *)(*(long *)(pcVar12 + uVar51 * 8) + -2 +
                                                          uVar55 * 2),&pvVar8->model_details);
                puVar11 = ppuVar14[uVar51];
                iVar28 = 0;
                if ((puVar11[uVar55 - 1] < puVar11[lVar47]) &&
                   (lVar41 = (long)ppsVar13[uVar51][uVar55 - 1], iVar28 = 0, -1 < lVar41)) {
                  iVar28 = pvVar8->dangle3[uVar24][lVar41];
                }
                if (2 < uVar24) {
                  iVar28 = iVar28 + pvVar8->TerminalAU;
                }
                iVar36 = iVar36 + iVar28;
              }
              piVar30[uVar55] = iVar36;
            }
          }
        }
        if (puVar18 != (undefined1 *)0x0) {
          while ((long)uVar54 <= (long)iVar23) {
            if (piVar30[uVar54] == 10000000) {
              uVar54 = uVar54 + 1;
            }
            else {
              iVar36 = (*(code *)puVar18)(uVar15,(int)uVar54 + -1,uVar54 + 1 & 0xffffffff,
                                          &sc_wrapper);
              piVar30[uVar54] = piVar30[uVar54] + iVar36;
              uVar54 = uVar54 + 1;
            }
          }
        }
        if ((((int)uVar26 <= iVar22 + i) && (*(int *)(lVar31 + -4 + lVar47 * 4) != 10000000)) &&
           (uVar19 = (*evaluate)(i,uVar26,i,iVar46,'\x0e',&hc_dat_local), uVar19 != '\0')) {
          iVar22 = *(int *)(lVar31 + -4 + lVar47 * 4);
          for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
            uVar26 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar49 * 2),
                                       (int)*(short *)(*(long *)(pcVar12 + uVar49 * 8) + -2 +
                                                      lVar47 * 2),&pvVar8->model_details);
            puVar11 = ppuVar14[uVar49];
            iVar36 = 0;
            if ((puVar11[lVar47 + -1] < puVar11[lVar47]) &&
               (lVar31 = (long)ppsVar13[uVar49][lVar47 + -1], iVar36 = 0, -1 < lVar31)) {
              iVar36 = pvVar8->dangle3[uVar26][lVar31];
            }
            if (2 < uVar26) {
              iVar36 = iVar36 + pvVar8->TerminalAU;
            }
            iVar22 = iVar22 + iVar36;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar36 = (*(code *)puVar17)(uVar15,uVar15,iVar46,&sc_wrapper);
            iVar22 = iVar22 + iVar36;
          }
          piVar30[lVar47] = iVar22;
        }
        free(pvVar33);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        psVar9 = (fc->field_23).field_0.sequence_encoding;
        ppcVar10 = fc->ptype_local;
        iVar46 = uVar26 - 1;
        iVar23 = iVar22 + i + 1;
        if ((int)uVar26 <= iVar23) {
          iVar23 = iVar46;
        }
        uVar44 = (ulong)(iVar36 + local_180);
        uVar49 = uVar44;
        while (uVar54 = uVar49, (long)uVar54 <= (long)iVar23) {
          piVar30[uVar54] = 10000000;
          if (*(int *)(lVar31 + -4 + uVar54 * 4) == 10000000) {
            uVar49 = uVar54 + 1;
          }
          else {
            uVar49 = uVar54 + 1;
            uVar19 = (*evaluate)(i,uVar26,(int)uVar54 + -1,(int)uVar49,'\x10',&hc_dat_local);
            if (uVar19 != '\0') {
              uVar24 = vrna_get_ptype_window(i,(int)uVar54 + -1,ppcVar10);
              lVar41 = (long)psVar9[uVar54];
              if (lVar41 < 0) {
                iVar36 = 0;
              }
              else {
                iVar36 = pvVar8->dangle3[uVar24][lVar41];
              }
              if (2 < uVar24) {
                iVar36 = iVar36 + pvVar8->TerminalAU;
              }
              piVar30[uVar54] = iVar36 + *(int *)(lVar31 + -4 + uVar54 * 4);
            }
          }
        }
        if (puVar18 != (undefined1 *)0x0) {
          while ((long)uVar44 <= (long)iVar23) {
            if (piVar30[uVar44] == 10000000) {
              uVar44 = uVar44 + 1;
            }
            else {
              iVar36 = (*(code *)puVar18)(uVar15,(int)uVar44 + -1,uVar44 + 1 & 0xffffffff,
                                          &sc_wrapper);
              piVar30[uVar44] = piVar30[uVar44] + iVar36;
              uVar44 = uVar44 + 1;
            }
          }
        }
        if ((((int)uVar26 <= iVar22 + i) && (*(int *)(lVar31 + -4 + lVar47 * 4) != 10000000)) &&
           (uVar19 = (*evaluate)(i,uVar26,i,iVar46,'\x0e',&hc_dat_local), uVar19 != '\0')) {
          uVar26 = vrna_get_ptype_window(i,iVar46,ppcVar10);
          lVar41 = (long)psVar9[lVar47];
          if (lVar41 < 0) {
            iVar22 = 0;
          }
          else {
            iVar22 = pvVar8->dangle3[uVar26][lVar41];
          }
          if (2 < uVar26) {
            iVar22 = iVar22 + pvVar8->TerminalAU;
          }
          piVar30[lVar47] = iVar22 + *(int *)(lVar31 + -4 + lVar47 * 4);
          if (puVar17 != (undefined1 *)0x0) {
            iVar22 = (*(code *)puVar17)(uVar15,uVar15,iVar46,&sc_wrapper);
            piVar30[lVar47] = piVar30[lVar47] + iVar22;
          }
        }
      }
      iVar36 = uVar3 - 1;
      if (iVar20 + 1 < (int)uVar3) {
        iVar36 = iVar20 + 1;
      }
      iVar22 = decompose_f3_ext_stem(fc,i,iVar36,piVar30);
      if (((int)uVar3 <= iVar20) && (piVar30[lVar53] <= iVar22)) {
        iVar22 = piVar30[lVar53];
      }
      free(pvVar32);
      uVar26 = fc->length;
      lVar31 = (long)(int)uVar26;
      iVar23 = fc->window_size;
      pvVar8 = fc->params;
      lVar47 = *(long *)((fc->matrices->field_2).field_0.c + lVar50 * 2);
      lVar41 = lVar47 + lVar50 * -4;
      iVar46 = (pvVar8->model_details).min_loop_size;
      pvVar32 = vrna_alloc(iVar23 * 4 + 0x18);
      puVar18 = sc_wrapper.decomp_stem1;
      puVar17 = sc_wrapper.red_stem;
      piVar30 = (int *)((long)pvVar32 + lVar40 * -4);
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar24 = (fc->field_23).field_1.n_seq;
        uVar44 = (ulong)uVar24;
        pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
        pvVar5 = (fc->field_23).field_0.sc;
        ppuVar14 = (fc->field_23).field_1.a2s;
        uVar24 = uVar24 * 2;
        pvVar33 = vrna_alloc(uVar24);
        pvVar34 = vrna_alloc(uVar24);
        for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
          uVar35 = 0xffff;
          if (1 < ppuVar14[uVar49][lVar50]) {
            uVar35 = *(undefined2 *)(*(long *)(&pvVar5->type + uVar49 * 2) + lVar50 * 2);
          }
          *(undefined2 *)((long)pvVar33 + uVar49 * 2) = uVar35;
          *(undefined2 *)((long)pvVar34 + uVar49 * 2) =
               *(undefined2 *)(*(long *)(pcVar12 + uVar49 * 8) + lVar50 * 2);
        }
        iVar37 = iVar23 + i + 1;
        iVar28 = uVar26 - 1;
        if (iVar37 < (int)uVar26) {
          iVar28 = iVar37;
        }
        lVar48 = (long)(iVar46 + local_180);
        for (lVar47 = lVar48; lVar47 <= iVar28; lVar47 = lVar47 + 1) {
          piVar30[lVar47] = 10000000;
          if ((*(int *)(lVar41 + lVar47 * 4) != 10000000) &&
             (uVar19 = (*evaluate)(i,uVar26,(int)lVar47,(int)lVar47 + 1,'\x14',&hc_dat_local),
             uVar19 != '\0')) {
            iVar46 = *(int *)(lVar41 + lVar47 * 4);
            for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
              uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar34 + uVar49 * 2),
                                         (int)*(short *)(*(long *)(pcVar12 + uVar49 * 8) +
                                                        lVar47 * 2),&pvVar8->model_details);
              lVar56 = (long)*(short *)((long)pvVar33 + uVar49 * 2);
              if (lVar56 < 0) {
                iVar37 = 0;
              }
              else {
                iVar37 = pvVar8->dangle5[uVar24][lVar56];
              }
              if (2 < uVar24) {
                iVar37 = iVar37 + pvVar8->TerminalAU;
              }
              iVar46 = iVar46 + iVar37;
            }
            piVar30[lVar47] = iVar46;
          }
        }
        if (puVar18 != (undefined1 *)0x0) {
          for (; lVar48 <= iVar28; lVar48 = lVar48 + 1) {
            if (piVar30[lVar48] != 10000000) {
              iVar46 = (*(code *)puVar18)(uVar15,lVar48,(int)lVar48 + 1,&sc_wrapper);
              piVar30[lVar48] = piVar30[lVar48] + iVar46;
            }
          }
        }
        if ((((int)uVar26 <= iVar23 + i) &&
            (piVar30[lVar31] = 10000000, *(int *)(lVar41 + lVar31 * 4) != 10000000)) &&
           (uVar19 = (*evaluate)(i,uVar26,local_180,uVar26,'\x0e',&hc_dat_local), uVar19 != '\0')) {
          iVar23 = *(int *)(lVar41 + lVar31 * 4);
          for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
            uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar34 + uVar49 * 2),
                                       (int)*(short *)(*(long *)(pcVar12 + uVar49 * 8) + lVar31 * 2)
                                       ,&pvVar8->model_details);
            lVar47 = (long)*(short *)((long)pvVar33 + uVar49 * 2);
            if (lVar47 < 0) {
              iVar46 = 0;
            }
            else {
              iVar46 = pvVar8->dangle5[uVar24][lVar47];
            }
            if (2 < uVar24) {
              iVar46 = iVar46 + pvVar8->TerminalAU;
            }
            iVar23 = iVar23 + iVar46;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar46 = (*(code *)puVar17)(uVar15,lVar50,uVar26,&sc_wrapper);
            iVar23 = iVar23 + iVar46;
          }
          piVar30[lVar31] = iVar23;
        }
        free(pvVar33);
        free(pvVar34);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        ppcVar10 = fc->ptype_local;
        iVar37 = iVar23 + i + 1;
        iVar28 = uVar26 - 1;
        if (iVar37 < (int)uVar26) {
          iVar28 = iVar37;
        }
        uVar1 = (fc->field_23).field_0.sequence_encoding[lVar40];
        uVar49 = (ulong)(local_180 + iVar46);
        lVar47 = lVar47 + uVar49 * 4 + lVar50 * -4;
        lVar56 = uVar49 * 4 + lVar40 * -4;
        for (lVar48 = 0; (long)(uVar49 + lVar48) <= (long)iVar28; lVar48 = lVar48 + 1) {
          *(undefined4 *)((long)pvVar32 + lVar48 * 4 + lVar56) = 10000000;
          if (*(int *)(lVar47 + lVar48 * 4) != 10000000) {
            iVar37 = iVar46 + i + (int)lVar48 + 1;
            uVar19 = (*evaluate)(i,uVar26,iVar37,iVar46 + i + 2 + (int)lVar48,'\x14',&hc_dat_local);
            if (uVar19 != '\0') {
              uVar24 = vrna_get_ptype_window(local_180,iVar37,ppcVar10);
              if ((short)uVar1 < 0) {
                iVar37 = 0;
              }
              else {
                iVar37 = pvVar8->dangle5[uVar24][uVar1];
              }
              if (2 < uVar24) {
                iVar37 = iVar37 + pvVar8->TerminalAU;
              }
              *(int *)((long)pvVar32 + lVar48 * 4 + lVar56) = iVar37 + *(int *)(lVar47 + lVar48 * 4)
              ;
            }
          }
        }
        if (puVar18 != (undefined1 *)0x0) {
          for (; (long)uVar49 <= (long)iVar28; uVar49 = uVar49 + 1) {
            if (piVar30[uVar49] != 10000000) {
              iVar46 = (*(code *)puVar18)(uVar15,uVar49 & 0xffffffff,(int)uVar49 + 1,&sc_wrapper);
              piVar30[uVar49] = piVar30[uVar49] + iVar46;
            }
          }
        }
        if ((((int)uVar26 <= iVar23 + i) &&
            (piVar30[lVar31] = 10000000, *(int *)(lVar41 + lVar31 * 4) != 10000000)) &&
           (uVar19 = (*evaluate)(i,uVar26,local_180,uVar26,'\x0e',&hc_dat_local), uVar19 != '\0')) {
          uVar24 = vrna_get_ptype_window(local_180,uVar26,ppcVar10);
          if ((short)uVar1 < 0) {
            iVar23 = 0;
          }
          else {
            iVar23 = pvVar8->dangle5[uVar24][uVar1];
          }
          if (2 < uVar24) {
            iVar23 = iVar23 + pvVar8->TerminalAU;
          }
          piVar30[lVar31] = iVar23 + *(int *)(lVar41 + lVar31 * 4);
          if (puVar17 != (undefined1 *)0x0) {
            iVar23 = (*(code *)puVar17)(uVar15,lVar50,uVar26,&sc_wrapper);
            piVar30[lVar31] = piVar30[lVar31] + iVar23;
          }
        }
      }
      iVar23 = decompose_f3_ext_stem(fc,i,iVar36,piVar30);
      if (((int)uVar3 <= iVar20) && (piVar30[lVar53] <= iVar23)) {
        iVar23 = piVar30[lVar53];
      }
      free(pvVar32);
      uVar26 = fc->length;
      lVar47 = (long)(int)uVar26;
      iVar46 = fc->window_size;
      pvVar8 = fc->params;
      lVar31 = lVar50 * -4 + *(long *)((fc->matrices->field_2).field_0.c + lVar50 * 2);
      iVar28 = (pvVar8->model_details).min_loop_size;
      pvVar32 = vrna_alloc(iVar46 * 4 + 0x18);
      puVar18 = sc_wrapper.decomp_stem1;
      puVar17 = sc_wrapper.red_stem;
      piVar30 = (int *)((long)pvVar32 + lVar40 * -4);
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar24 = (fc->field_23).field_1.n_seq;
        uVar44 = (ulong)uVar24;
        pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
        pvVar5 = (fc->field_23).field_0.sc;
        ppsVar13 = (fc->field_23).field_1.S3;
        ppuVar14 = (fc->field_23).field_1.a2s;
        uVar24 = uVar24 * 2;
        pvVar33 = vrna_alloc(uVar24);
        pvVar34 = vrna_alloc(uVar24);
        for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
          uVar35 = 0xffff;
          if (1 < ppuVar14[uVar49][lVar50]) {
            uVar35 = *(undefined2 *)(*(long *)(&pvVar5->type + uVar49 * 2) + lVar50 * 2);
          }
          *(undefined2 *)((long)pvVar33 + uVar49 * 2) = uVar35;
          *(undefined2 *)((long)pvVar34 + uVar49 * 2) =
               *(undefined2 *)(*(long *)(pcVar12 + uVar49 * 8) + lVar50 * 2);
        }
        iVar37 = iVar46 + i + 1;
        iVar42 = uVar26 - 1;
        if ((int)uVar26 <= iVar37) {
          iVar37 = iVar42;
        }
        lVar48 = (long)(iVar28 + local_180);
        lVar41 = lVar48;
        while (lVar56 = lVar41, lVar56 <= iVar37) {
          piVar30[lVar56] = 10000000;
          if (*(int *)(lVar31 + -4 + lVar56 * 4) == 10000000) {
            lVar41 = lVar56 + 1;
          }
          else {
            lVar41 = lVar56 + 1;
            uVar19 = (*evaluate)(i,uVar26,(int)lVar56 + -1,(int)lVar41,'\x14',&hc_dat_local);
            if (uVar19 != '\0') {
              iVar28 = *(int *)(lVar31 + -4 + lVar56 * 4);
              for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
                uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar34 + uVar49 * 2),
                                           (int)*(short *)(*(long *)(pcVar12 + uVar49 * 8) + -2 +
                                                          lVar56 * 2),&pvVar8->model_details);
                iVar27 = -1;
                if (ppuVar14[uVar49][lVar56 + -1] < ppuVar14[uVar49][lVar47]) {
                  iVar27 = (int)ppsVar13[uVar49][lVar56 + -1];
                }
                iVar27 = vrna_E_ext_stem(uVar24,(int)*(short *)((long)pvVar33 + uVar49 * 2),iVar27,
                                         pvVar8);
                iVar28 = iVar28 + iVar27;
              }
              piVar30[lVar56] = iVar28;
            }
          }
        }
        if (puVar18 != (undefined1 *)0x0) {
          while (lVar48 <= iVar37) {
            if (piVar30[lVar48] == 10000000) {
              lVar48 = lVar48 + 1;
            }
            else {
              iVar28 = (*(code *)puVar18)(uVar15,(int)lVar48 + -1,lVar48 + 1,&sc_wrapper);
              piVar30[lVar48] = piVar30[lVar48] + iVar28;
              lVar48 = lVar48 + 1;
            }
          }
        }
        if ((((int)uVar26 <= iVar46 + i) && (*(int *)(lVar31 + -4 + lVar47 * 4) != 10000000)) &&
           (uVar19 = (*evaluate)(i,uVar26,local_180,iVar42,'\x0e',&hc_dat_local), uVar19 != '\0')) {
          iVar46 = *(int *)(lVar31 + -4 + lVar47 * 4);
          for (uVar49 = 0; uVar44 != uVar49; uVar49 = uVar49 + 1) {
            uVar26 = vrna_get_ptype_md((int)*(short *)((long)pvVar34 + uVar49 * 2),
                                       (int)*(short *)(*(long *)(pcVar12 + uVar49 * 8) + -2 +
                                                      lVar47 * 2),&pvVar8->model_details);
            iVar28 = -1;
            if (ppuVar14[uVar49][lVar47 + -1] < ppuVar14[uVar49][lVar47]) {
              iVar28 = (int)ppsVar13[uVar49][lVar47 + -1];
            }
            iVar28 = vrna_E_ext_stem(uVar26,(int)*(short *)((long)pvVar33 + uVar49 * 2),iVar28,
                                     pvVar8);
            iVar46 = iVar46 + iVar28;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar28 = (*(code *)puVar17)(uVar15,lVar50,iVar42,&sc_wrapper);
            iVar46 = iVar46 + iVar28;
          }
          piVar30[lVar47] = iVar46;
        }
        free(pvVar33);
        free(pvVar34);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        psVar9 = (fc->field_23).field_0.sequence_encoding;
        ppcVar10 = fc->ptype_local;
        iVar42 = uVar26 - 1;
        iVar37 = iVar46 + i + 1;
        if ((int)uVar26 <= iVar37) {
          iVar37 = iVar42;
        }
        sVar2 = psVar9[lVar40];
        uVar44 = (ulong)(iVar28 + local_180);
        uVar49 = uVar44;
        while (uVar54 = uVar49, (long)uVar54 <= (long)iVar37) {
          piVar30[uVar54] = 10000000;
          if (*(int *)(lVar31 + -4 + uVar54 * 4) == 10000000) {
            uVar49 = uVar54 + 1;
          }
          else {
            uVar49 = uVar54 + 1;
            uVar19 = (*evaluate)(i,uVar26,(int)uVar54 + -1,(int)uVar49,'\x14',&hc_dat_local);
            if (uVar19 != '\0') {
              uVar24 = vrna_get_ptype_window(local_180,(int)uVar54 + -1,ppcVar10);
              iVar28 = *(int *)(lVar31 + -4 + uVar54 * 4);
              iVar27 = vrna_E_ext_stem(uVar24,(int)sVar2,(int)psVar9[uVar54],pvVar8);
              piVar30[uVar54] = iVar27 + iVar28;
            }
          }
        }
        if (puVar18 != (undefined1 *)0x0) {
          while ((long)uVar44 <= (long)iVar37) {
            if (piVar30[uVar44] == 10000000) {
              uVar44 = uVar44 + 1;
            }
            else {
              iVar28 = (*(code *)puVar18)(uVar15,(int)uVar44 + -1,uVar44 + 1 & 0xffffffff,
                                          &sc_wrapper);
              piVar30[uVar44] = piVar30[uVar44] + iVar28;
              uVar44 = uVar44 + 1;
            }
          }
        }
        if ((((int)uVar26 <= iVar46 + i) && (*(int *)(lVar31 + -4 + lVar47 * 4) != 10000000)) &&
           (uVar19 = (*evaluate)(i,uVar26,local_180,iVar42,'\x0e',&hc_dat_local), uVar19 != '\0')) {
          uVar26 = vrna_get_ptype_window(local_180,iVar42,ppcVar10);
          iVar46 = *(int *)(lVar31 + -4 + lVar47 * 4);
          iVar28 = vrna_E_ext_stem(uVar26,(int)sVar2,(int)psVar9[lVar47],pvVar8);
          piVar30[lVar47] = iVar28 + iVar46;
          if (puVar17 != (undefined1 *)0x0) {
            iVar46 = (*(code *)puVar17)(uVar15,lVar50,iVar42,&sc_wrapper);
            piVar30[lVar47] = piVar30[lVar47] + iVar46;
          }
        }
      }
      iVar36 = decompose_f3_ext_stem(fc,i,iVar36,piVar30);
      if (((int)uVar3 <= iVar20) && (piVar30[lVar53] <= iVar36)) {
        iVar36 = piVar30[lVar53];
      }
      if (iVar21 < iVar22) {
        iVar22 = iVar21;
      }
      if (iVar23 <= iVar22) {
        iVar22 = iVar23;
      }
      free(pvVar32);
      if (iVar36 <= iVar22) {
        iVar22 = iVar36;
      }
      if (local_124 <= iVar22) {
        iVar22 = local_124;
      }
      if (9999999 < iVar22) {
        iVar22 = 10000000;
      }
      goto LAB_00118dae;
    }
    piVar30 = f3_get_stem_contributions_d0(fc,i,evaluate,&hc_dat_local,&sc_wrapper);
    iVar20 = iVar20 + i;
    iVar22 = uVar3 - 1;
    if (iVar20 < (int)uVar3) {
      iVar22 = iVar20;
    }
    iVar22 = decompose_f3_ext_stem(fc,i,iVar22,piVar30);
    if (((int)uVar3 <= iVar20) && (piVar30[lVar53] <= iVar22)) {
      iVar22 = piVar30[lVar53];
    }
    piVar30 = piVar30 + lVar40;
  }
  free(piVar30);
  if (local_124 < iVar22) {
    iVar22 = local_124;
  }
LAB_00118dae:
  if (iVar38 != 0) {
    uVar3 = fc->length;
    lVar50 = *(long *)((fc->matrices->field_2).field_0.fc + lVar40 * 2);
    lVar53 = fc->window_size + lVar40;
    iVar38 = 10000000;
    for (lVar47 = (long)(local_180 + (fc->params->model_details).min_loop_size);
        (lVar47 < (int)uVar3 && (lVar47 <= lVar53)); lVar47 = lVar47 + 1) {
      iVar20 = (fc->matrices->field_2).field_0.f5[lVar47 + 1];
      if ((iVar20 != 10000000) &&
         ((iVar21 = *(int *)(lVar50 + lVar40 * -4 + lVar47 * 4), iVar21 != 10000000 &&
          (iVar21 = iVar21 + iVar20, iVar21 <= iVar38)))) {
        iVar38 = iVar21;
      }
    }
    if (((int)uVar3 <= (int)lVar53) &&
       (iVar20 = *(int *)(lVar50 + (long)(int)(uVar3 - i) * 4), iVar20 <= iVar38)) {
      iVar38 = iVar20;
    }
    if (iVar38 <= iVar22) {
      iVar22 = iVar38;
    }
  }
  free(sc_wrapper.up_comparative);
  free(sc_wrapper.user_cb_comparative);
  free(sc_wrapper.user_data_comparative);
  return iVar22;
}

Assistant:

PUBLIC int
vrna_E_ext_loop_3(vrna_fold_compound_t  *fc,
                  int                   i)
{
  if (fc) {
    int                       e, en, dangle_model, with_gquad;
    vrna_param_t              *P;
    vrna_md_t                 *md;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f3      sc_wrapper;

    e = INF;

    P             = fc->params;
    md            = &(P->model_details);
    dangle_model  = md->dangles;
    with_gquad    = md->gquad;
    evaluate      = prepare_hc_default_window(fc, &hc_dat_local);

    init_sc_wrapper_f3(fc, i, &sc_wrapper);

    /* first case: i stays unpaired */
    e = reduce_f3_up(fc, i, evaluate, &hc_dat_local, &sc_wrapper);

    /* decompose into stem followed by exterior loop part */
    switch (dangle_model) {
      case 0:
        en  = decompose_f3_ext_stem_d0(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      case 2:
        en  = decompose_f3_ext_stem_d2(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      default:
        en  = decompose_f3_ext_stem_d1(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;
    }

    if (with_gquad) {
      en  = add_f3_gquad(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
      e   = MIN2(e, en);
    }

    free_sc_wrapper_f3(&sc_wrapper);

    return e;
  }

  return INF;
}